

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnData::InitializeColumn
          (ColumnData *this,PersistentColumnData *column_data,BaseStatistics *target_stats)

{
  anon_union_40_2_2e033cff_for_stats_union *paVar1;
  CompressionType compression_type;
  uint uVar2;
  BlockManager *block_manager;
  DatabaseInstance *db;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *block_id;
  idx_t start;
  element_type *count;
  BaseStatistics statistics;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var3;
  SegmentLock l;
  undefined8 in_stack_ffffffffffffff00;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> in_stack_ffffffffffffff08;
  long *plVar4;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> in_stack_ffffffffffffff18;
  ColumnSegment *this_00;
  __atomic_base<unsigned_long> in_stack_ffffffffffffff20;
  bool in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff29;
  __atomic_base<unsigned_long> _Var5;
  DatabaseInstance *type;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var6;
  BaseStatistics local_88;
  
  LOCK();
  (this->count).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  _Var3._M_head_impl =
       (BaseStatistics *)
       (column_data->pointers).
       super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
       super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var6._M_head_impl =
       (BaseStatistics *)
       (column_data->pointers).
       super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
       super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var3._M_head_impl != _Var6._M_head_impl) {
    type = (DatabaseInstance *)&this->type;
    _Var5._M_i = (__int_type)&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock
    ;
    do {
      LOCK();
      (this->count).super___atomic_base<unsigned_long>._M_i =
           (long)&((((shared_ptr<duckdb::ExtraTypeInfo,_true> *)((long)_Var3._M_head_impl + 8))->
                   internal).super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_vptr_ExtraTypeInfo +
           (this->count).super___atomic_base<unsigned_long>._M_i;
      UNLOCK();
      BaseStatistics::Merge(target_stats,_Var3._M_head_impl + 0x28);
      block_manager = this->block_manager;
      db = this->info->db->db;
      block_id = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)_Var3._M_head_impl + 0x10))->
                 _M_pi;
      uVar2 = *(uint *)((long)_Var3._M_head_impl + 0x18);
      start = *(idx_t *)_Var3._M_head_impl;
      count = (((shared_ptr<duckdb::ExtraTypeInfo,_true> *)((long)_Var3._M_head_impl + 8))->internal
              ).super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      compression_type = *(CompressionType *)((long)_Var3._M_head_impl + 0x20);
      BaseStatistics::BaseStatistics(&local_88,_Var3._M_head_impl + 0x28);
      plVar4 = *(long **)((long)_Var3._M_head_impl + 0x80);
      paVar1 = (anon_union_40_2_2e033cff_for_stats_union *)((long)_Var3._M_head_impl + 0x80);
      ((data_t *)paVar1)[0] = '\0';
      ((data_t *)paVar1)[1] = '\0';
      ((data_t *)paVar1)[2] = '\0';
      ((data_t *)paVar1)[3] = '\0';
      ((data_t *)paVar1)[4] = '\0';
      ((data_t *)paVar1)[5] = '\0';
      ((data_t *)paVar1)[6] = '\0';
      ((data_t *)paVar1)[7] = '\0';
      statistics.type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&stack0xffffffffffffff10;
      statistics.type._0_8_ = &local_88;
      statistics.type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_ffffffffffffff00;
      statistics._24_8_ = in_stack_ffffffffffffff08._M_head_impl;
      statistics.distinct_count = (idx_t)plVar4;
      statistics.stats_union.string_data.min = (data_t  [8])in_stack_ffffffffffffff18._M_head_impl;
      statistics.stats_union._8_1_ = (char)in_stack_ffffffffffffff20._M_i;
      statistics.stats_union._9_1_ = (char)(in_stack_ffffffffffffff20._M_i >> 8);
      statistics.stats_union._10_1_ = (char)(in_stack_ffffffffffffff20._M_i >> 0x10);
      statistics.stats_union._11_1_ = (char)(in_stack_ffffffffffffff20._M_i >> 0x18);
      statistics.stats_union._12_1_ = (char)(in_stack_ffffffffffffff20._M_i >> 0x20);
      statistics.stats_union._13_1_ = (char)(in_stack_ffffffffffffff20._M_i >> 0x28);
      statistics.stats_union._14_1_ = (char)(in_stack_ffffffffffffff20._M_i >> 0x30);
      statistics.stats_union._15_1_ = (char)(in_stack_ffffffffffffff20._M_i >> 0x38);
      statistics.stats_union.string_data.has_unicode = in_stack_ffffffffffffff28;
      statistics.stats_union._17_7_ = in_stack_ffffffffffffff29;
      statistics.stats_union._24_8_ = _Var5._M_i;
      statistics.stats_union._32_8_ = type;
      statistics.child_stats.
      super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>)
           (unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>)
           _Var6._M_head_impl;
      ColumnSegment::CreatePersistentSegment
                ((ColumnSegment *)&stack0xffffffffffffff18,db,block_manager,(block_id_t)block_id,
                 (ulong)uVar2,(LogicalType *)type,start,(idx_t)count,compression_type,statistics,
                 (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
                  )target_stats);
      in_stack_ffffffffffffff20._M_i = _Var5._M_i;
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
        in_stack_ffffffffffffff20._M_i = _Var5._M_i;
      }
      BaseStatistics::~BaseStatistics(&local_88);
      _Var5._M_i = in_stack_ffffffffffffff20._M_i;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&stack0xffffffffffffff20);
      in_stack_ffffffffffffff28 = true;
      this_00 = (ColumnSegment *)0x0;
      AppendSegment(this,(SegmentLock *)&stack0xffffffffffffff20,
                    (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                     *)&stack0xffffffffffffff08);
      if ((__uniq_ptr_data<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true,_true>
           )in_stack_ffffffffffffff18._M_head_impl !=
          (tuple<duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>)0x0) {
        ColumnSegment::~ColumnSegment(in_stack_ffffffffffffff18._M_head_impl);
        operator_delete(in_stack_ffffffffffffff18._M_head_impl);
      }
      in_stack_ffffffffffffff08._M_head_impl = (ColumnSegment *)0x0;
      ::std::unique_lock<std::mutex>::~unique_lock
                ((unique_lock<std::mutex> *)&stack0xffffffffffffff20);
      in_stack_ffffffffffffff18._M_head_impl = this_00;
      if (this_00 != (ColumnSegment *)0x0) {
        ColumnSegment::~ColumnSegment(this_00);
        operator_delete(this_00);
      }
      _Var3._M_head_impl = _Var3._M_head_impl + 0x88;
    } while (_Var3._M_head_impl != _Var6._M_head_impl);
  }
  return;
}

Assistant:

void ColumnData::InitializeColumn(PersistentColumnData &column_data, BaseStatistics &target_stats) {
	D_ASSERT(type.InternalType() == column_data.physical_type);
	// construct the segments based on the data pointers
	this->count = 0;
	for (auto &data_pointer : column_data.pointers) {
		// Update the count and statistics
		this->count += data_pointer.tuple_count;

		// Merge the statistics. If this is a child column, the target_stats reference will point into the parents stats
		// otherwise if this is a top level column, `stats->statistics` == `target_stats`

		target_stats.Merge(data_pointer.statistics);

		// create a persistent segment
		auto segment = ColumnSegment::CreatePersistentSegment(
		    GetDatabase(), block_manager, data_pointer.block_pointer.block_id, data_pointer.block_pointer.offset, type,
		    data_pointer.row_start, data_pointer.tuple_count, data_pointer.compression_type,
		    std::move(data_pointer.statistics), std::move(data_pointer.segment_state));

		auto l = data.Lock();
		AppendSegment(l, std::move(segment));
	}
}